

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelHeightCase::checkTextureState
          (TextureLevelHeightCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  pointer pTVar1;
  bool bVar2;
  pointer pTVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  pTVar3 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar3 != pTVar1) {
    bVar4 = true;
    if (0 < (int)((ulong)((long)pTVar1 - (long)pTVar3) >> 3) * -0x55555555) {
      lVar5 = 0xc;
      lVar6 = 0;
      do {
        bVar2 = verifyTextureLevelParameterEqual
                          (gl,spec->queryTarget,*(int *)((long)&pTVar3->width + lVar5),0x1001,
                           *(int *)((long)pTVar3 + lVar5 + -8),
                           (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
        bVar4 = (bool)(bVar4 & bVar2);
        lVar6 = lVar6 + 1;
        pTVar3 = (spec->levels).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x18;
      } while (lVar6 < (int)((ulong)((long)(spec->levels).
                                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3
                                    ) >> 3) * -0x55555555);
    }
    return bVar4;
  }
  bVar4 = verifyTextureLevelParameterEqual
                    (gl,spec->queryTarget,0,0x1001,0,
                     (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
  return bVar4;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		const int	initialValue	= 0;
		bool		allOk			= true;

		if (spec.levels.empty())
		{
			const int queryLevel	= 0;
			const int refValue		= initialValue;

			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_HEIGHT, refValue, m_type);
		}
		else
		{
			for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
			{
				const int queryLevel	= spec.levels[levelNdx].level;
				const int refValue		= spec.levels[levelNdx].height;

				allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_HEIGHT, refValue, m_type);
			}
		}

		return allOk;
	}